

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void __thiscall duckdb::Linenoise::EditMoveWordRight(Linenoise *this)

{
  bool bVar1;
  size_t sVar2;
  Linenoise *in_RDI;
  byte local_11;
  
  if (in_RDI->pos != in_RDI->len) {
    do {
      sVar2 = NextChar((Linenoise *)0x1f8ddb);
      in_RDI->pos = sVar2;
      local_11 = 0;
      if (in_RDI->pos != in_RDI->len) {
        bVar1 = IsWordBoundary(in_RDI->buf[in_RDI->pos]);
        local_11 = bVar1 ^ 0xff;
      }
    } while ((local_11 & 1) != 0);
    RefreshLine(in_RDI);
  }
  return;
}

Assistant:

void Linenoise::EditMoveWordRight() {
	if (pos == len) {
		return;
	}
	do {
		pos = NextChar();
	} while (pos != len && !IsWordBoundary(buf[pos]));
	RefreshLine();
}